

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O3

NULLCArray NULLCTypeInfo::MemberName(int member,int *type)

{
  uint *puVar1;
  size_t sVar2;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  NULLCArray NVar6;
  
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0x2d,"NULLCArray NULLCTypeInfo::MemberName(int, int *)");
  }
  if (*(uint *)(linker + 0x20c) <= (uint)*type) {
    pcVar5 = 
    "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
    ;
    goto LAB_00129d3a;
  }
  lVar4 = (ulong)(uint)*type * 0x50;
  puVar1 = (uint *)(*(long *)(linker + 0x200) + lVar4);
  if (*(int *)(*(long *)(linker + 0x200) + 0x10 + lVar4) == 4) {
    if ((uint)member < puVar1[6]) {
      if (*(int *)(linker + 0x29c) != 0) {
        pcVar5 = (char *)((ulong)*puVar1 + *(long *)(linker + 0x290));
        sVar2 = strlen(pcVar5);
        pcVar5 = pcVar5 + ((int)sVar2 + 1);
        if (0 < member) {
          do {
            sVar2 = strlen(pcVar5);
            pcVar5 = pcVar5 + ((int)sVar2 + 1);
            member = member + -1;
          } while (member != 0);
        }
        sVar2 = strlen(pcVar5);
        uVar3 = (int)sVar2 + 1;
        goto LAB_00129ce4;
      }
    }
    else if (*puVar1 < *(uint *)(linker + 0x29c)) {
      nullcThrowError("typeid::memberName: member number illegal, type (%s) has only %d members",
                      (ulong)*puVar1 + *(long *)(linker + 0x290));
      goto LAB_00129ccf;
    }
  }
  else if (*puVar1 < *(uint *)(linker + 0x29c)) {
    nullcThrowError("typeid::memberName: type (%s) is not a class",
                    (ulong)*puVar1 + *(long *)(linker + 0x290));
LAB_00129ccf:
    uVar3 = 0;
    pcVar5 = (char *)0x0;
LAB_00129ce4:
    NVar6.len = uVar3;
    NVar6.ptr = pcVar5;
    return NVar6;
  }
  pcVar5 = 
  "T &FastVector<char>::operator[](unsigned int) [T = char, zeroNewMemory = false, skipConstructor = false]"
  ;
LAB_00129d3a:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/../Array.h"
                ,0x7f,pcVar5);
}

Assistant:

NULLCArray MemberName(int member, int* type)
	{
		assert(linker);
		NULLCArray ret;

		ExternTypeInfo &exType = linker->exTypes[*type];
		if(exType.subCat != ExternTypeInfo::CAT_CLASS)
		{
			nullcThrowError("typeid::memberName: type (%s) is not a class", &linker->exSymbols[exType.offsetToName]);
			return NULLCArray();
		}
		if((unsigned int)member >= exType.memberCount)
		{
			nullcThrowError("typeid::memberName: member number illegal, type (%s) has only %d members", &linker->exSymbols[exType.offsetToName], exType.memberCount);
			return NULLCArray();
		}
		char *symbols = &linker->exSymbols[0];
		unsigned int strLength = (unsigned int)strlen(symbols + exType.offsetToName) + 1;
		const char *memberName = symbols + exType.offsetToName + strLength;
		for(int n = 0; n < member; n++)
		{
			strLength = (unsigned int)strlen(memberName) + 1;
			memberName += strLength;
		}

		ret.ptr = (char*)memberName;
		ret.len = (unsigned int)strlen(memberName) + 1;
		return ret;
	}